

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O3

void __thiscall avro::RecordSchema::RecordSchema(RecordSchema *this,string *name)

{
  Node *pNVar1;
  Name local_60;
  
  pNVar1 = (Node *)operator_new(0xd0);
  pNVar1->type_ = AVRO_RECORD;
  pNVar1->locked_ = false;
  pNVar1[1]._vptr_Node = (_func_int **)(pNVar1 + 2);
  pNVar1[1].type_ = AVRO_STRING;
  pNVar1[1].locked_ = false;
  *(undefined3 *)&pNVar1[1].field_0xd = 0;
  *(undefined1 *)&pNVar1[2]._vptr_Node = 0;
  pNVar1[3]._vptr_Node = (_func_int **)(pNVar1 + 4);
  pNVar1[3].type_ = AVRO_STRING;
  pNVar1[3].locked_ = false;
  *(undefined3 *)&pNVar1[3].field_0xd = 0;
  *(undefined1 *)&pNVar1[4]._vptr_Node = 0;
  *(undefined4 *)&pNVar1[9]._vptr_Node = 0;
  pNVar1[9].type_ = AVRO_STRING;
  pNVar1[9].locked_ = false;
  *(undefined3 *)&pNVar1[9].field_0xd = 0;
  pNVar1[5]._vptr_Node = (_func_int **)0x0;
  pNVar1[5].type_ = AVRO_STRING;
  pNVar1[5].locked_ = false;
  *(undefined3 *)&pNVar1[5].field_0xd = 0;
  pNVar1[6]._vptr_Node = (_func_int **)0x0;
  pNVar1[6].type_ = AVRO_STRING;
  pNVar1[6].locked_ = false;
  *(undefined3 *)&pNVar1[6].field_0xd = 0;
  pNVar1[7]._vptr_Node = (_func_int **)0x0;
  pNVar1[7].type_ = AVRO_STRING;
  pNVar1[7].locked_ = false;
  *(undefined3 *)&pNVar1[7].field_0xd = 0;
  pNVar1[10]._vptr_Node = (_func_int **)(pNVar1 + 9);
  *(Node **)&pNVar1[10].type_ = pNVar1 + 9;
  pNVar1[0xb]._vptr_Node = (_func_int **)0x0;
  pNVar1->_vptr_Node = (_func_int **)&PTR__NodeRecord_00180e18;
  pNVar1[0xb].type_ = AVRO_STRING;
  pNVar1[0xb].locked_ = false;
  *(undefined3 *)&pNVar1[0xb].field_0xd = 0;
  pNVar1[0xc]._vptr_Node = (_func_int **)0x0;
  pNVar1[0xc].type_ = AVRO_STRING;
  pNVar1[0xc].locked_ = false;
  *(undefined3 *)&pNVar1[0xc].field_0xd = 0;
  (this->super_Schema)._vptr_Schema = (_func_int **)&PTR__Schema_001823a0;
  boost::shared_ptr<avro::Node>::shared_ptr<avro::Node>(&(this->super_Schema).node_,pNVar1);
  (this->super_Schema)._vptr_Schema = (_func_int **)&PTR__Schema_001823d0;
  pNVar1 = (this->super_Schema).node_.px;
  Name::Name(&local_60,name);
  Node::checkLock(pNVar1);
  (*pNVar1->_vptr_Node[0x10])(pNVar1,&local_60);
  (*pNVar1->_vptr_Node[0x11])(pNVar1,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.simpleName_._M_dataplus._M_p != &local_60.simpleName_.field_2) {
    operator_delete(local_60.simpleName_._M_dataplus._M_p,
                    local_60.simpleName_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.ns_._M_dataplus._M_p != &local_60.ns_.field_2) {
    operator_delete(local_60.ns_._M_dataplus._M_p,local_60.ns_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

RecordSchema::RecordSchema(const std::string &name) :
    Schema(new NodeRecord)
{
    node_->setName(name);
}